

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x2x.cc
# Opt level: O1

bool __thiscall
anon_unknown.dwarf_21a7::DataTransform<float,_signed_char>::Run
          (DataTransform<float,_signed_char> *this,istream *input_stream)

{
  char cVar1;
  NumericType NVar2;
  WarningType WVar3;
  float fVar4;
  char *__nptr;
  bool bVar5;
  int *piVar6;
  undefined8 uVar7;
  ostream *poVar8;
  size_t sVar9;
  char cVar10;
  char data_to_write;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  int iVar15;
  longdouble in_ST0;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  float input_data;
  string word;
  char buffer [128];
  float local_260;
  float local_25c;
  string local_258;
  string *local_238;
  char *local_230;
  long local_228;
  char local_220 [96];
  ios_base local_1c0 [264];
  char local_b8 [136];
  
  local_238 = &this->print_format_;
  iVar15 = 0;
  do {
    if (this->is_ascii_input_ == true) {
      local_230 = local_220;
      local_228 = 0;
      local_220[0] = '\0';
      std::operator>>(input_stream,(string *)&local_230);
      __nptr = local_230;
      if (local_228 == 0) {
        iVar14 = 2;
        bVar5 = false;
      }
      else {
        piVar6 = __errno_location();
        iVar14 = *piVar6;
        *piVar6 = 0;
        strtold(__nptr,(char **)&local_258);
        if (local_258._M_dataplus._M_p == __nptr) {
          uVar7 = std::__throw_invalid_argument("stold");
LAB_0013ceb8:
          if (local_230 != local_220) {
            operator_delete(local_230);
          }
          _Unwind_Resume(uVar7);
        }
        if (*piVar6 == 0) {
          *piVar6 = iVar14;
        }
        else if (*piVar6 == 0x22) {
          uVar7 = std::__throw_out_of_range("stold");
          goto LAB_0013ceb8;
        }
        local_260 = (float)in_ST0;
        iVar14 = 0;
        bVar5 = true;
        in_ST0 = in_ST1;
        in_ST1 = in_ST2;
        in_ST2 = in_ST3;
        in_ST3 = in_ST4;
        in_ST4 = in_ST5;
        in_ST5 = in_ST6;
        in_ST6 = in_ST7;
      }
      if (local_230 != local_220) {
        operator_delete(local_230);
      }
      if (bVar5) {
LAB_0013cb9b:
        cVar10 = (char)(int)local_260;
        data_to_write = this->minimum_value_;
        cVar1 = this->maximum_value_;
        if (data_to_write < cVar1) {
          NVar2 = this->input_numeric_type_;
          if (NVar2 == kFloatingPoint) {
            local_25c = local_260;
            bVar5 = true;
            in_ST6 = in_ST5;
            in_ST7 = in_ST5;
            if (((float)(short)data_to_write <= local_260) &&
               (data_to_write = cVar1, local_260 <= (float)(short)cVar1)) goto LAB_0013cc67;
          }
          else {
            uVar11 = (ulong)cVar1;
            if (NVar2 == kUnsignedInteger) {
              uVar13 = (long)(local_260 - 9.223372e+18) & (long)local_260 >> 0x3f | (long)local_260;
              bVar5 = true;
              if (((ulong)(long)data_to_write <= uVar13) &&
                 (bVar5 = uVar11 < uVar13, data_to_write = cVar10, bVar5)) {
                data_to_write = cVar1;
              }
            }
            else {
              if (NVar2 != kSignedInteger) goto LAB_0013cc67;
              lVar12 = (long)local_260;
              bVar5 = true;
              if ((data_to_write <= lVar12) &&
                 (bVar5 = (long)uVar11 < lVar12, data_to_write = cVar10, (long)uVar11 < lVar12)) {
                data_to_write = cVar1;
              }
            }
          }
        }
        else {
LAB_0013cc67:
          bVar5 = false;
          data_to_write = cVar10;
        }
        if ((!bVar5) && (this->rounding_ != false)) {
          if (local_260 <= 0.0) {
            fVar4 = local_260 + -0.5;
          }
          else {
            fVar4 = local_260 + 0.5;
          }
          data_to_write = (char)(int)fVar4;
        }
        if ((bool)(bVar5 & this->warning_type_ != kIgnore)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_230);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&local_230,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar8,"th data is over the range of output type",0x28);
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"x2x","");
          sptk::PrintErrorMessage(&local_258,(ostringstream *)&local_230);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_258._M_dataplus._M_p != &local_258.field_2) {
            operator_delete(local_258._M_dataplus._M_p);
          }
          WVar3 = this->warning_type_;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_230);
          std::ios_base::~ios_base(local_1c0);
          iVar14 = 1;
          if (WVar3 == kExit) goto LAB_0013ce08;
        }
        if (this->is_ascii_output_ == true) {
          bVar5 = sptk::SnPrintf<signed_char>(data_to_write,local_238,0x80,local_b8);
          iVar14 = 1;
          if (bVar5) {
            sVar9 = strlen(local_b8);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_b8,sVar9)
            ;
            if ((iVar15 + 1) % this->num_column_ == 0) {
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
              std::ostream::put(-0x78);
              std::ostream::flush();
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
            }
LAB_0013ce05:
            iVar14 = 0;
          }
        }
        else {
          bVar5 = sptk::WriteStream<signed_char>(data_to_write,(ostream *)&std::cout);
          iVar14 = 1;
          if (bVar5) goto LAB_0013ce05;
        }
      }
    }
    else {
      bVar5 = sptk::ReadStream<float>(&local_260,input_stream);
      iVar14 = 2;
      if (bVar5) goto LAB_0013cb9b;
    }
LAB_0013ce08:
    if (iVar14 != 0) {
      if (iVar14 == 2) {
        bVar5 = true;
        if ((this->is_ascii_output_ == true) && (iVar15 % this->num_column_ != 0)) {
          std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x78);
          std::ostream::put(-0x78);
          std::ostream::flush();
        }
      }
      else {
        bVar5 = false;
      }
      return bVar5;
    }
    iVar15 = iVar15 + 1;
  } while( true );
}

Assistant:

bool Run(std::istream* input_stream) const override {
    char buffer[kBufferSize];
    int index(0);
    for (;; ++index) {
      // Read.
      T1 input_data;
      if (is_ascii_input_) {
        std::string word;
        *input_stream >> word;
        if (word.empty()) break;
        try {
          input_data = static_cast<T1>(std::stold(word));
        } catch (std::invalid_argument&) {
          return false;
        }
      } else {
        if (!sptk::ReadStream(&input_data, input_stream)) {
          break;
        }
      }

      // Convert.
      T2 output_data(static_cast<T2>(input_data));

      bool is_clipped(false);
      {
        // Clipping.
        if (minimum_value_ < maximum_value_) {
          if (kSignedInteger == input_numeric_type_) {
            if (static_cast<std::int64_t>(input_data) <
                static_cast<std::int64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::int64_t>(maximum_value_) <
                       static_cast<std::int64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kUnsignedInteger == input_numeric_type_) {
            if (static_cast<std::uint64_t>(input_data) <
                static_cast<std::uint64_t>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<std::uint64_t>(maximum_value_) <
                       static_cast<std::uint64_t>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          } else if (kFloatingPoint == input_numeric_type_) {
            if (static_cast<long double>(input_data) <
                static_cast<long double>(minimum_value_)) {
              output_data = minimum_value_;
              is_clipped = true;
            } else if (static_cast<long double>(maximum_value_) <
                       static_cast<long double>(input_data)) {
              output_data = maximum_value_;
              is_clipped = true;
            }
          }
        }

        // Rounding.
        if (rounding_ && !is_clipped) {
          if (0.0 < input_data) {
            output_data = static_cast<T2>(input_data + 0.5);
          } else {
            output_data = static_cast<T2>(input_data - 0.5);
          }
        }
      }

      if (is_clipped && kIgnore != warning_type_) {
        std::ostringstream error_message;
        error_message << index << "th data is over the range of output type";
        sptk::PrintErrorMessage("x2x", error_message);
        if (kExit == warning_type_) return false;
      }

      // Write output.
      if (is_ascii_output_) {
        if (!sptk::SnPrintf(output_data, print_format_, sizeof(buffer),
                            buffer)) {
          return false;
        }
        std::cout << buffer;
        if (0 == (index + 1) % num_column_) {
          std::cout << std::endl;
        } else {
          std::cout << "\t";
        }
      } else {
        if (!sptk::WriteStream(output_data, &std::cout)) {
          return false;
        }
      }
    }

    if (is_ascii_output_ && 0 != index % num_column_) {
      std::cout << std::endl;
    }

    return true;
  }